

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListModeViewBase::doStaticLayout(QListModeViewBase *this,QListViewLayoutInfo *info)

{
  Representation *pRVar1;
  QList<int> *this_00;
  int iVar2;
  QListView *pQVar3;
  undefined1 auVar4 [12];
  QPoint QVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  QPoint QVar13;
  long lVar14;
  QSize QVar15;
  int iVar16;
  QListViewLayoutInfo *pQVar17;
  QSize *pQVar18;
  int iVar19;
  Representation RVar20;
  int row;
  Representation RVar21;
  Representation RVar22;
  QSize *pQVar23;
  parameter_type pVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  long in_FS_OFFSET;
  bool bVar28;
  undefined1 auVar29 [16];
  QPoint local_198;
  QRect local_130;
  QModelIndex local_120;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar23 = &info->grid;
  pRVar1 = &(info->grid).ht;
  bVar28 = ((info->grid).ht.m_i | (info->grid).wd.m_i) < 0;
  QVar13 = initStaticLayout(this,info);
  local_198 = (QPoint)((ulong)QVar13 >> 0x20);
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  pQVar3 = (this->super_QCommonListViewBase).qq;
  (**(code **)(*(long *)&(pQVar3->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(pQVar3,&local_108);
  uVar6 = (info->bounds).x1;
  uVar7 = (info->bounds).y1;
  uVar8 = (info->bounds).x2;
  uVar9 = (info->bounds).y2;
  auVar4._8_4_ = uVar9;
  auVar4._4_4_ = uVar8;
  iVar16 = info->spacing;
  local_108.super_QStyleOption.rect.x1.m_i = uVar6 + iVar16;
  local_108.super_QStyleOption.rect.y1.m_i = uVar7 + iVar16;
  auVar4._0_4_ = uVar7 - iVar16;
  auVar29._0_8_ = auVar4._0_8_ << 0x20;
  auVar29._8_4_ = uVar8 - iVar16;
  auVar29._12_4_ = uVar9 - iVar16;
  local_108.super_QStyleOption.rect._8_8_ = auVar29._8_8_;
  if (info->flow == LeftToRight) {
    lVar14 = 8;
    pQVar17 = info;
    pQVar18 = (QSize *)pRVar1;
    QVar5 = QVar13;
  }
  else {
    lVar14 = 0xc;
    pQVar17 = (QListViewLayoutInfo *)&(info->bounds).y1;
    pQVar18 = pQVar23;
    pQVar23 = (QSize *)pRVar1;
    QVar5 = local_198;
    local_198 = (QPoint)((ulong)QVar13 & 0xffffffff);
  }
  uVar25 = (ulong)QVar5 & 0xffffffff;
  iVar16 = (pQVar17->bounds).x1.m_i;
  iVar2 = *(int *)((long)&(info->bounds).x1.m_i + lVar14);
  iVar12 = (pQVar18->wd).m_i;
  iVar26 = iVar12;
  if (bVar28) {
    iVar26 = (this->super_QCommonListViewBase).batchSavedDeltaSeg;
  }
  iVar27 = (pQVar23->wd).m_i;
  row = info->first;
  this_00 = &this->flowPositions;
  while( true ) {
    iVar19 = info->last;
    pVar24 = (parameter_type)uVar25;
    RVar22 = local_198.xp.m_i;
    if (iVar19 < row) break;
    bVar10 = QCommonListViewBase::isHidden(&this->super_QCommonListViewBase,row);
    if (bVar10) {
      QList<int>::append(this_00,pVar24);
    }
    else {
      if (bVar28) {
        QCommonListViewBase::modelIndex(&local_120,&this->super_QCommonListViewBase,row);
        QVar15 = QCommonListViewBase::itemSize
                           (&this->super_QCommonListViewBase,&local_108,&local_120);
        iVar12 = info->spacing;
        if (info->flow == LeftToRight) {
          iVar27 = iVar12 + QVar15.wd.m_i.m_i;
          iVar12 = QVar15.ht.m_i.m_i + iVar12;
        }
        else {
          iVar27 = QVar15.ht.m_i.m_i + iVar12;
          iVar12 = QVar15.wd.m_i.m_i + iVar12;
        }
      }
      iVar19 = iVar27 + pVar24;
      if ((info->wrap == true) && ((iVar2 - iVar16) + 1 <= iVar19)) {
        QList<int>::append(&this->segmentExtents,pVar24);
        local_198.xp.m_i = RVar22.m_i + iVar26 + info->spacing;
        local_198.yp.m_i = 0;
        pVar24 = info->spacing + iVar16;
        QList<int>::append(&this->segmentPositions,local_198.xp.m_i);
        QList<int>::append(&this->segmentStartRows,row);
        iVar19 = iVar27 + pVar24;
        iVar26 = 0;
      }
      QList<int>::append(&this->scrollValueMap,(parameter_type)(this->flowPositions).d.size);
      QList<int>::append(this_00,pVar24);
      if (iVar26 < iVar12) {
        iVar26 = iVar12;
      }
      uVar25 = (ulong)(uint)(iVar19 + info->spacing);
    }
    row = row + 1;
  }
  this->batchSavedPosition = pVar24;
  (this->super_QCommonListViewBase).batchSavedDeltaSeg = iVar26;
  (this->super_QCommonListViewBase).batchStartRow = iVar19 + 1;
  iVar16 = 0;
  if (iVar19 == info->max) {
    iVar16 = info->spacing;
  }
  iVar16 = pVar24 - iVar16;
  lVar14 = (this->segmentPositions).d.size;
  if (info->flow == LeftToRight) {
    RVar21.m_i = iVar16;
    if (lVar14 != 1) {
      RVar21.m_i = (info->bounds).x2.m_i;
    }
    RVar20.m_i = RVar22.m_i + iVar26;
  }
  else {
    RVar20.m_i = iVar16;
    if (lVar14 != 1) {
      RVar20.m_i = (info->bounds).y2.m_i;
    }
    RVar21.m_i = RVar22.m_i + iVar26;
  }
  QVar15.ht.m_i = RVar20.m_i;
  QVar15.wd.m_i = RVar21.m_i;
  (this->super_QCommonListViewBase).contentsSize = QVar15;
  if (info->last == info->max) {
    QList<int>::append(&this->segmentExtents,iVar16);
    QList<int>::append(&this->scrollValueMap,(parameter_type)(this->flowPositions).d.size);
    QList<int>::append(this_00,iVar16);
    pVar24 = 0x7fffffff;
    if (info->wrap != false) {
      pVar24 = RVar22.m_i + iVar26;
    }
    QList<int>::append(&this->segmentPositions,pVar24);
  }
  local_120.r = (int)QVar13.xp.m_i;
  local_120.c = (int)QVar13.yp.m_i;
  local_120.i._0_4_ = RVar21.m_i;
  local_120.i._4_4_ = RVar20.m_i;
  local_130 = QCommonListViewBase::clipRect(&this->super_QCommonListViewBase);
  cVar11 = QRect::intersects(&local_130);
  if (cVar11 != '\0') {
    QWidget::update((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                    super_QAbstractScrollAreaPrivate.viewport);
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModeViewBase::doStaticLayout(const QListViewLayoutInfo &info)
{
    const bool useItemSize = !info.grid.isValid();
    const QPoint topLeft = initStaticLayout(info);
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    option.rect = info.bounds;
    option.rect.adjust(info.spacing, info.spacing, -info.spacing, -info.spacing);

    // The static layout data structures are as follows:
    // One vector contains the coordinate in the direction of layout flow.
    // Another vector contains the coordinates of the segments.
    // A third vector contains the index (model row) of the first item
    // of each segment.

    int segStartPosition;
    int segEndPosition;
    int deltaFlowPosition;
    int deltaSegPosition;
    int deltaSegHint;
    int flowPosition;
    int segPosition;

    if (info.flow == QListView::LeftToRight) {
        segStartPosition = info.bounds.left();
        segEndPosition = info.bounds.width();
        flowPosition = topLeft.x();
        segPosition = topLeft.y();
        deltaFlowPosition = info.grid.width(); // dx
        deltaSegPosition = useItemSize ? batchSavedDeltaSeg : info.grid.height(); // dy
        deltaSegHint = info.grid.height();
    } else { // flow == QListView::TopToBottom
        segStartPosition = info.bounds.top();
        segEndPosition = info.bounds.height();
        flowPosition = topLeft.y();
        segPosition = topLeft.x();
        deltaFlowPosition = info.grid.height(); // dy
        deltaSegPosition = useItemSize ? batchSavedDeltaSeg : info.grid.width(); // dx
        deltaSegHint = info.grid.width();
    }

    for (int row = info.first; row <= info.last; ++row) {
        if (isHidden(row)) { // ###
            flowPositions.append(flowPosition);
        } else {
            // if we are not using a grid, we need to find the deltas
            if (useItemSize) {
                QSize hint = itemSize(option, modelIndex(row));
                if (info.flow == QListView::LeftToRight) {
                    deltaFlowPosition = hint.width() + info.spacing;
                    deltaSegHint = hint.height() + info.spacing;
                } else { // TopToBottom
                    deltaFlowPosition = hint.height() + info.spacing;
                    deltaSegHint = hint.width() + info.spacing;
                }
            }
            // create new segment
            if (info.wrap && (flowPosition + deltaFlowPosition >= segEndPosition)) {
                segmentExtents.append(flowPosition);
                flowPosition = info.spacing + segStartPosition;
                segPosition += info.spacing + deltaSegPosition;
                segmentPositions.append(segPosition);
                segmentStartRows.append(row);
                deltaSegPosition = 0;
            }
            // save the flow position of this item
            scrollValueMap.append(flowPositions.size());
            flowPositions.append(flowPosition);
            // prepare for the next item
            deltaSegPosition = qMax(deltaSegHint, deltaSegPosition);
            flowPosition += info.spacing + deltaFlowPosition;
        }
    }
    // used when laying out next batch
    batchSavedPosition = flowPosition;
    batchSavedDeltaSeg = deltaSegPosition;
    batchStartRow = info.last + 1;
    if (info.last == info.max)
        flowPosition -= info.spacing; // remove extra spacing
    // set the contents size
    QRect rect = info.bounds;
    if (info.flow == QListView::LeftToRight) {
        rect.setRight(segmentPositions.size() == 1 ? flowPosition : info.bounds.right());
        rect.setBottom(segPosition + deltaSegPosition);
    } else { // TopToBottom
        rect.setRight(segPosition + deltaSegPosition);
        rect.setBottom(segmentPositions.size() == 1 ? flowPosition : info.bounds.bottom());
    }
    contentsSize = QSize(rect.right(), rect.bottom());
    // if it is the last batch, save the end of the segments
    if (info.last == info.max) {
        segmentExtents.append(flowPosition);
        scrollValueMap.append(flowPositions.size());
        flowPositions.append(flowPosition);
        segmentPositions.append(info.wrap ? segPosition + deltaSegPosition : INT_MAX);
    }
    // if the new items are visible, update the viewport
    QRect changedRect(topLeft, rect.bottomRight());
    if (clipRect().intersects(changedRect))
        viewport()->update();
}